

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.c
# Opt level: O1

void * lyplg_type_print_bits
                 (ly_ctx *ctx,lyd_value *value,LY_VALUE_FORMAT format,void *UNUSED_prefix_data,
                 ly_bool *dynamic,size_t *value_len)

{
  lysc_type_bits *type;
  long lVar1;
  LY_ERR LVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  bool bVar8;
  
  if (format == LY_VALUE_LYB) {
    type = (lysc_type_bits *)value->realtype;
    *dynamic = '\0';
    if (value_len != (size_t *)0x0) {
      sVar3 = lyplg_type_bits_bitmap_size(type);
      *value_len = sVar3;
    }
    return (void *)(value->field_2).dec64;
  }
  if (value->_canonical != (char *)0x0) goto LAB_001be2c1;
  lVar1 = *(long *)((long)&value->field_2 + 8);
  __dest = strdup("");
  if (__dest != (char *)0x0) {
    sVar4 = 0;
    uVar7 = 0;
    do {
      if (lVar1 == 0) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ulong *)(lVar1 + -8);
      }
      bVar8 = uVar5 <= uVar7;
      if (bVar8) goto LAB_001be3d0;
      sVar6 = strlen((char *)**(undefined8 **)(lVar1 + uVar7 * 8));
      if (sVar4 == 0) {
        __dest = (char *)ly_realloc(__dest,sVar6 + 1);
        if (__dest == (char *)0x0) goto LAB_001be3c4;
        strcpy(__dest,(char *)**(undefined8 **)(lVar1 + uVar7 * 8));
        sVar4 = strlen(__dest);
      }
      else {
        __dest = (char *)ly_realloc(__dest,sVar6 + sVar4 + 2);
        if (__dest == (char *)0x0) goto LAB_001be3c4;
        sprintf(__dest + sVar4," %s",**(undefined8 **)(lVar1 + uVar7 * 8));
        sVar6 = strlen((char *)**(undefined8 **)(lVar1 + uVar7 * 8));
        sVar4 = sVar4 + sVar6 + 1;
      }
      uVar7 = uVar7 + 1;
    } while( true );
  }
  __dest = (char *)0x0;
  bVar8 = false;
LAB_001be3d0:
  if (!bVar8) {
    return (void *)0x0;
  }
  LVar2 = lydict_insert_zc(ctx,__dest,&value->_canonical);
  if (LVar2 != LY_SUCCESS) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyplg_type_print_bits");
    return (void *)0x0;
  }
LAB_001be2c1:
  if (dynamic != (ly_bool *)0x0) {
    *dynamic = '\0';
  }
  if (value_len != (size_t *)0x0) {
    sVar4 = strlen(value->_canonical);
    *value_len = sVar4;
  }
  return value->_canonical;
LAB_001be3c4:
  __dest = (char *)0x0;
  goto LAB_001be3d0;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_bits(const struct ly_ctx *ctx, const struct lyd_value *value, LY_VALUE_FORMAT format,
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    struct lysc_type_bits *type_bits = (struct lysc_type_bits *)value->realtype;
    struct lyd_value_bits *val;
    char *ret;

    LYD_VALUE_GET(value, val);

    if (format == LY_VALUE_LYB) {
        *dynamic = 0;
        if (value_len) {
            *value_len = lyplg_type_bits_bitmap_size(type_bits);
        }
        return val->bitmap;
    }

    /* generate canonical value if not already */
    if (!value->_canonical) {
        /* get the canonical value */
        if (bits_items2canon(val->items, &ret)) {
            return NULL;
        }

        /* store it */
        if (lydict_insert_zc(ctx, ret, (const char **)&value->_canonical)) {
            LOGMEM(ctx);
            return NULL;
        }
    }

    /* use the cached canonical value */
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = strlen(value->_canonical);
    }
    return value->_canonical;
}